

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  int fromDirFd;
  PathPtr toPath_00;
  PathPtr path;
  DiskHandle *pDVar1;
  String *pSVar2;
  bool bVar3;
  WriteMode WVar4;
  NullableValue<int> *pNVar5;
  int *piVar6;
  size_t sVar7;
  PathPtr PVar8;
  Fault local_1e0;
  Fault f_2;
  String local_1a8;
  ArrayPtr<const_char> local_190;
  String local_180;
  ArrayPtr<const_char> local_168;
  int local_154;
  int error;
  Fault f_1;
  TransferMode *local_140;
  undefined1 local_138 [8];
  DebugComparison<kj::TransferMode_&,_kj::TransferMode> _kjCondition_1;
  int *fromFd_1;
  NullableValue<int> local_fc;
  NullableValue<int> _fromFd1432;
  Function<int_(kj::StringPtr)> local_d8;
  String *local_c8;
  String *pSStack_c0;
  int *local_b0;
  int *fromFd;
  NullableValue<int> local_9c;
  NullableValue<int> _fromFd1425;
  Fault local_88;
  Fault f;
  size_t local_78;
  DebugExpression<unsigned_long> local_70;
  undefined1 local_68 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  TransferMode mode_local;
  Directory *fromDirectory_local;
  WriteMode toMode_local;
  DiskHandle *this_local;
  PathPtr toPath_local;
  
  toPath_local.parts.ptr = (String *)toPath.parts.size_;
  this_local = (DiskHandle *)toPath.parts.ptr;
  _kjCondition._36_4_ = mode;
  local_78 = PathPtr::size((PathPtr *)&this_local);
  local_70 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_78);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_68,&local_70,
             (int *)((long)&f.exception + 4));
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[19]>
              (&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x58e,FAILED,"toPath.size() > 0","_kjCondition,\"can\'t replace self\"",
               (DebugComparison<unsigned_long,_int> *)local_68,(char (*) [19])"can\'t replace self")
    ;
    toPath_local.parts.size_._7_1_ = 0;
    kj::_::Debug::Fault::~Fault(&local_88);
    goto LAB_009ad9a7;
  }
  if (_kjCondition._36_4_ == 1) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)();
    pNVar5 = kj::_::readMaybe<int>((Maybe<int> *)((long)&fromFd + 4));
    kj::_::NullableValue<int>::NullableValue(&local_9c,pNVar5);
    Maybe<int>::~Maybe((Maybe<int> *)((long)&fromFd + 4));
    piVar6 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&local_9c);
    if (piVar6 != (int *)0x0) {
      register0x00000000 = kj::_::NullableValue<int>::operator*(&local_9c);
      local_c8 = (String *)this_local;
      pSStack_c0 = toPath_local.parts.ptr;
      local_b0 = register0x00000000;
      Function<int(kj::StringPtr)>::
      Function<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::_lambda(kj::StringPtr)_1_>
                ((Function<int(kj::StringPtr)> *)&local_d8,(Type *)&_fromFd1432.field_1);
      path.parts.size_ = (size_t)pSStack_c0;
      path.parts.ptr = local_c8;
      toPath_local.parts.size_._7_1_ = tryReplaceNode(this,path,toMode,&local_d8);
      Function<int_(kj::StringPtr)>::~Function(&local_d8);
    }
    _fromFd1432._1_3_ = 0;
    _fromFd1432.isSet = piVar6 != (int *)0x0;
    kj::_::NullableValue<int>::~NullableValue(&local_9c);
joined_r0x009ad919:
    if (_fromFd1432._0_4_ != 0) goto LAB_009ad9a7;
  }
  else if (_kjCondition._36_4_ == 0) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)();
    pNVar5 = kj::_::readMaybe<int>((Maybe<int> *)((long)&fromFd_1 + 4));
    kj::_::NullableValue<int>::NullableValue(&local_fc,pNVar5);
    Maybe<int>::~Maybe((Maybe<int> *)((long)&fromFd_1 + 4));
    piVar6 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&local_fc);
    if (piVar6 == (int *)0x0) {
LAB_009ad8fb:
      _fromFd1432.isSet = false;
      _fromFd1432._1_3_ = 0;
    }
    else {
      _kjCondition_1._32_8_ = kj::_::NullableValue<int>::operator*(&local_fc);
      local_140 = (TransferMode *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (TransferMode *)&_kjCondition.field_0x24);
      f_1.exception._4_4_ = 0;
      kj::_::DebugExpression<kj::TransferMode&>::operator==
                ((DebugComparison<kj::TransferMode_&,_kj::TransferMode> *)local_138,
                 (DebugExpression<kj::TransferMode&> *)&local_140,
                 (TransferMode *)((long)&f_1.exception + 4));
      bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
      if (!bVar3) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::TransferMode&,kj::TransferMode>&>
                  ((Fault *)&stack0xfffffffffffffeb0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x599,FAILED,"mode == TransferMode::MOVE","_kjCondition,",
                   (DebugComparison<kj::TransferMode_&,_kj::TransferMode> *)local_138);
        kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffeb0);
      }
      local_154 = 0;
      PathPtr::toString(&local_180,(PathPtr *)&this_local,false);
      StringPtr::StringPtr((StringPtr *)&local_168,&local_180);
      fromDirFd = *(int *)_kjCondition_1._32_8_;
      PathPtr::toString(&local_1a8,&fromPath,false);
      StringPtr::StringPtr((StringPtr *)&local_190,&local_1a8);
      bVar3 = tryCommitReplacement
                        (this,(StringPtr)local_168,fromDirFd,(StringPtr)local_190,toMode,&local_154)
      ;
      String::~String(&local_1a8);
      String::~String(&local_180);
      if (bVar3) {
        toPath_local.parts.size_._7_1_ = 1;
        _fromFd1432.isSet = true;
        _fromFd1432._1_3_ = 0;
      }
      else if (local_154 == 0) {
        toPath_local.parts.size_._7_1_ = 0;
        _fromFd1432.isSet = true;
        _fromFd1432._1_3_ = 0;
      }
      else if (local_154 == 2) {
        bVar3 = has<kj::WriteMode,void>(toMode,CREATE);
        if (((bVar3) && (bVar3 = has<kj::WriteMode,void>(toMode,CREATE_PARENT), bVar3)) &&
           (sVar7 = PathPtr::size((PathPtr *)&this_local), sVar7 != 0)) {
          PVar8 = PathPtr::parent((PathPtr *)&this_local);
          WVar4 = operator|(CREATE,MODIFY);
          WVar4 = operator|(WVar4,CREATE_PARENT);
          bVar3 = tryMkdir(this,PVar8,WVar4,true);
          pSVar2 = toPath_local.parts.ptr;
          pDVar1 = this_local;
          if (bVar3) {
            WVar4 = operator-(toMode,CREATE_PARENT);
            f_2.exception = (Exception *)fromPath.parts.ptr;
            PVar8.parts.size_ = (size_t)pSVar2;
            PVar8.parts.ptr = (String *)pDVar1;
            toPath_local.parts.size_._7_1_ =
                 tryTransfer(this,PVar8,WVar4,fromDirectory,fromPath,_kjCondition._36_4_,self);
            _fromFd1432.isSet = true;
            _fromFd1432._1_3_ = 0;
            goto LAB_009ad905;
          }
        }
        toPath_local.parts.size_._7_1_ = 0;
        _fromFd1432.isSet = true;
        _fromFd1432._1_3_ = 0;
      }
      else {
        if (local_154 == 0x12) goto LAB_009ad8fb;
        kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                  (&local_1e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x5b5,local_154,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                   (PathPtr *)&this_local);
        toPath_local.parts.size_._7_1_ = 0;
        _fromFd1432.isSet = true;
        _fromFd1432._1_3_ = 0;
        kj::_::Debug::Fault::~Fault(&local_1e0);
      }
    }
LAB_009ad905:
    kj::_::NullableValue<int>::~NullableValue(&local_fc);
    goto joined_r0x009ad919;
  }
  toPath_00.parts.size_ = (size_t)toPath_local.parts.ptr;
  toPath_00.parts.ptr = (String *)this_local;
  toPath_local.parts.size_._7_1_ =
       Directory::tryTransfer(self,toPath_00,toMode,fromDirectory,fromPath,_kjCondition._36_4_);
LAB_009ad9a7:
  return (bool)(toPath_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }